

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImagePaletteCopy(gdImagePtr to,gdImagePtr from)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int xlate [256];
  int local_438 [258];
  
  if ((to->trueColor == 0) && (from->trueColor == 0)) {
    memset(local_438,0xff,0x400);
    if (0 < to->sy) {
      lVar6 = 0;
      do {
        if (0 < to->sx) {
          lVar4 = 0;
          do {
            puVar2 = to->pixels[lVar6];
            bVar1 = puVar2[lVar4];
            if (local_438[bVar1] == -1) {
              uVar5 = (ulong)((uint)bVar1 * 4);
              iVar3 = gdImageColorClosestAlpha
                                (from,*(int *)((long)to->red + uVar5),
                                 *(int *)((long)to->green + uVar5),*(int *)((long)to->blue + uVar5),
                                 *(int *)((long)to->alpha + uVar5));
              *(int *)((long)local_438 + uVar5) = iVar3;
            }
            puVar2[lVar4] = (uchar)local_438[bVar1];
            lVar4 = lVar4 + 1;
          } while (lVar4 < to->sx);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < to->sy);
    }
    iVar3 = from->colorsTotal;
    if (0 < iVar3) {
      lVar6 = 0;
      do {
        to->red[lVar6] = from->red[lVar6];
        to->blue[lVar6] = from->blue[lVar6];
        to->green[lVar6] = from->green[lVar6];
        to->alpha[lVar6] = from->alpha[lVar6];
        to->open[lVar6] = 0;
        lVar6 = lVar6 + 1;
        iVar3 = from->colorsTotal;
      } while (lVar6 < iVar3);
    }
    if (iVar3 < to->colorsTotal) {
      lVar6 = (long)iVar3;
      do {
        to->open[lVar6] = 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < to->colorsTotal);
    }
    to->colorsTotal = from->colorsTotal;
    return;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImagePaletteCopy (gdImagePtr to, gdImagePtr from)
{
	int i;
	int x, y, p;
	int xlate[256];
	if (to->trueColor) {
		return;
	}
	if (from->trueColor) {
		return;
	}

	for (i = 0; i < 256; i++) {
		xlate[i] = -1;
	};

	for (y = 0; y < (to->sy); y++) {
		for (x = 0; x < (to->sx); x++) {
			/* Optimization: no gdImageGetPixel */
			p = to->pixels[y][x];
			if (xlate[p] == -1) {
				/* This ought to use HWB, but we don't have an alpha-aware
				   version of that yet. */
				xlate[p] =
				    gdImageColorClosestAlpha (from, to->red[p], to->green[p],
				                              to->blue[p], to->alpha[p]);
				/*printf("Mapping %d (%d, %d, %d, %d) to %d (%d, %d, %d, %d)\n", */
				/*      p,  to->red[p], to->green[p], to->blue[p], to->alpha[p], */
				/*      xlate[p], from->red[xlate[p]], from->green[xlate[p]], from->blue[xlate[p]], from->alpha[xlate[p]]); */
			};
			/* Optimization: no gdImageSetPixel */
			to->pixels[y][x] = xlate[p];
		};
	};

	for (i = 0; (i < (from->colorsTotal)); i++) {
		/*printf("Copying color %d (%d, %d, %d, %d)\n", i, from->red[i], from->blue[i], from->green[i], from->alpha[i]); */
		to->red[i] = from->red[i];
		to->blue[i] = from->blue[i];
		to->green[i] = from->green[i];
		to->alpha[i] = from->alpha[i];
		to->open[i] = 0;
	};

	for (i = from->colorsTotal; (i < to->colorsTotal); i++) {
		to->open[i] = 1;
	};

	to->colorsTotal = from->colorsTotal;

}